

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.c
# Opt level: O0

void arm_cpu_initfn_arm(uc_struct_conflict1 *uc,CPUState *obj)

{
  TranslationBlock *pTVar1;
  CPUARMState *env;
  ARMCPU *cpu;
  CPUState *obj_local;
  uc_struct_conflict1 *uc_local;
  
  obj[1].tb_jmp_cache[0x624] = (TranslationBlock *)uc;
  cpu_set_cpustate_pointers((ArchCPU_conflict *)obj);
  pTVar1 = (TranslationBlock *)
           g_hash_table_new_full(g_int_hash,g_int_equal,g_free,cpreg_hashtable_data_destroy);
  obj[1].tb_jmp_cache[0x625] = pTVar1;
  obj[1].tb_jmp_cache[0x667] = (TranslationBlock *)0x0;
  obj[1].tb_jmp_cache[0x668] = (TranslationBlock *)0x0;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x62e) = 1;
  *(undefined4 *)(obj[1].tb_jmp_cache + 0x62e) = 2;
  return;
}

Assistant:

void arm_cpu_initfn(struct uc_struct *uc, CPUState *obj)
{
    ARMCPU *cpu = ARM_CPU(obj);
    CPUARMState *env = &cpu->env;

    env->uc = uc;
    cpu_set_cpustate_pointers(cpu);
    cpu->cp_regs = g_hash_table_new_full(g_int_hash, g_int_equal,
                                         g_free, cpreg_hashtable_data_destroy);

    QLIST_INIT(&cpu->pre_el_change_hooks);
    QLIST_INIT(&cpu->el_change_hooks);

    /* DTB consumers generally don't in fact care what the 'compatible'
     * string is, so always provide some string and trust that a hypothetical
     * picky DTB consumer will also provide a helpful error message.
     */
    cpu->psci_version = 1; /* By default assume PSCI v0.1 */

    cpu->psci_version = 2; /* TCG implements PSCI 0.2 */
}